

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O3

void __thiscall absl::lts_20240722::Mutex::UnlockSlow(Mutex *this,SynchWaitParams *waitp)

{
  SynchWaitParams *pSVar1;
  Condition *pCVar2;
  PerThreadSynch *pPVar3;
  PerThreadSynch *pPVar4;
  byte bVar5;
  PerThreadSynch *pPVar6;
  PerThreadSynch *pPVar7;
  bool bVar8;
  uint uVar9;
  PerThreadSynch *pPVar10;
  PerThreadSynch *pPVar11;
  long lVar12;
  ulong uVar13;
  int mode;
  int extraout_EDX;
  PerThreadSynch *extraout_RDX;
  PerThreadSynch *extraout_RDX_00;
  PerThreadSynch *extraout_RDX_01;
  undefined1 *puVar14;
  PerThreadSynch *extraout_RDX_02;
  uint uVar15;
  ulong uVar16;
  PerThreadSynch *head;
  long lVar17;
  bool bVar18;
  PerThreadSynch *local_60;
  PerThreadSynch *local_58;
  PerThreadSynch *local_50;
  PerThreadSynch *wake_list;
  PerThreadSynch *local_40;
  PerThreadSynch *local_38;
  
  uVar16 = (this->mu_).super___atomic_base<long>._M_i;
  AssertReaderHeld(this);
  CheckForMutexCorruption(uVar16,"Unlock");
  puVar14 = (undefined1 *)extraout_RDX;
  if ((uVar16 & 0x10) != 0) {
    PostSynchEvent(this,((uVar16 & 8) == 0) + 8);
    puVar14 = (undefined1 *)extraout_RDX_00;
  }
  wake_list = (PerThreadSynch *)0x1;
  if (((waitp != (SynchWaitParams *)0x0) && (waitp->thread->waitp != (SynchWaitParams *)0x0)) &&
     (waitp->thread->suppress_fatal_errors != true)) {
    absl::lts_20240722::raw_log_internal::RawLog
              (kFatal,"mutex.cc",0x847,"Check %s failed: %s",
               "waitp == nullptr || waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors"
               ,"detected illegal recursion into Mutex code");
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/synchronization/mutex.cc"
                  ,0x847,"void absl::Mutex::UnlockSlow(SynchWaitParams *)");
  }
  local_58 = (PerThreadSynch *)0x0;
  local_60 = (PerThreadSynch *)0x0;
  uVar9 = 0;
  local_50 = (PerThreadSynch *)0x0;
  pPVar10 = (PerThreadSynch *)0x0;
LAB_001069a9:
  do {
    mode = (int)puVar14;
    uVar16 = (this->mu_).super___atomic_base<long>._M_i;
    uVar15 = (uint)uVar16;
    if (((uVar16 & 8) == 0) || ((uVar15 & 6) == 4 || waitp != (SynchWaitParams *)0x0)) {
      if ((uVar15 & 5) == 1 && waitp == (SynchWaitParams *)0x0) {
        bVar18 = ExactlyOneReader(uVar16);
        uVar13 = (uVar16 - bVar18) - 0x100;
        mode = extraout_EDX;
        goto LAB_001069f9;
      }
      if ((uVar16 & 0x40) != 0) goto LAB_00106a1f;
      LOCK();
      bVar18 = uVar16 == (this->mu_).super___atomic_base<long>._M_i;
      if (bVar18) {
        (this->mu_).super___atomic_base<long>._M_i = uVar16 | 0x40;
      }
      UNLOCK();
      if (!bVar18) goto LAB_00106a1f;
      if ((uVar16 & 4) == 0) {
        if (waitp == (SynchWaitParams *)0x0) {
          absl::lts_20240722::raw_log_internal::RawLog
                    (kFatal,"mutex.cc",0x864,"Check %s failed: %s","waitp != nullptr",
                     "UnlockSlow is confused");
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/synchronization/mutex.cc"
                        ,0x864,"void absl::Mutex::UnlockSlow(SynchWaitParams *)");
        }
        bVar18 = true;
        do {
          uVar16 = (this->mu_).super___atomic_base<long>._M_i;
          uVar13 = uVar16 - 0x100;
          if ((long)uVar16 < 0x100) {
            uVar13 = uVar16;
          }
          if (bVar18) {
            bVar18 = waitp->cv_word == (atomic<long> *)0x0;
            pPVar10 = Enqueue((PerThreadSynch *)0x0,waitp,uVar13,2);
          }
          else {
            pPVar10 = (PerThreadSynch *)0x0;
            bVar18 = false;
          }
          uVar9 = 0xffffffd7;
          if ((uVar16 & 8) == 0) {
            bVar8 = ExactlyOneReader(uVar16);
            uVar9 = 0xffffffd7;
            if (bVar8) {
              uVar9 = 0xffffffde;
            }
          }
          uVar13 = uVar13 & 0xffffffffffffff00;
          if (pPVar10 != (PerThreadSynch *)0x0) {
            uVar13 = (ulong)pPVar10 | 4;
          }
          LOCK();
          bVar8 = uVar16 == (this->mu_).super___atomic_base<long>._M_i;
          if (bVar8) {
            (this->mu_).super___atomic_base<long>._M_i = uVar13 | uVar9 & (uint)uVar16 & 0x9f;
          }
          UNLOCK();
        } while (!bVar8);
        goto LAB_00106e9a;
      }
      head = (PerThreadSynch *)(uVar16 & 0xffffffffffffff00);
      if (((uVar16 & 1) != 0) && (0x100 < (long)(head->readers & 0xffffffffffffff00U))) {
        head->readers = head->readers - 0x100;
        if (waitp != (SynchWaitParams *)0x0) {
          pPVar10 = Enqueue(head,waitp,uVar16,2);
          if (pPVar10 == (PerThreadSynch *)0x0) {
            absl::lts_20240722::raw_log_internal::RawLog
                      (kFatal,"mutex.cc",0x890,"Check %s failed: %s","new_h != nullptr",
                       "waiters disappeared during Enqueue()!");
            __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/synchronization/mutex.cc"
                          ,0x890,"void absl::Mutex::UnlockSlow(SynchWaitParams *)");
          }
          uVar15 = uVar15 & 0xbf;
          goto LAB_00106d7e;
        }
        goto LAB_00106e97;
      }
      if (local_58 != (PerThreadSynch *)0x0) {
        if (head->maybe_unlocking == false) {
          absl::lts_20240722::raw_log_internal::RawLog
                    (kFatal,"mutex.cc",0x89c,"Check %s failed: %s",
                     "old_h == nullptr || h->maybe_unlocking","Mutex queue changed beneath us");
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/synchronization/mutex.cc"
                        ,0x89c,"void absl::Mutex::UnlockSlow(SynchWaitParams *)");
        }
        if (local_58->may_skip == false) {
          local_58->may_skip = true;
          if (local_58->skip != (PerThreadSynch *)0x0) {
            absl::lts_20240722::raw_log_internal::RawLog
                      (kFatal,"mutex.cc",0x8a2,"Check %s failed: %s","old_h->skip == nullptr",
                       "illegal skip from head");
            __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/synchronization/mutex.cc"
                          ,0x8a2,"void absl::Mutex::UnlockSlow(SynchWaitParams *)");
          }
          if (local_58 != head) {
            local_38 = local_58->next;
            bVar18 = MuEquivalentWaiter(local_58,local_38);
            if (bVar18) {
              local_58->skip = local_38;
            }
          }
        }
      }
      pSVar1 = head->next->waitp;
      puVar14 = kExclusiveS;
      if ((pSVar1->how != (MuHow)kExclusiveS) || (pSVar1->cond != (Condition *)0x0)) {
        local_40 = pPVar10;
        if ((local_60 != (PerThreadSynch *)0x0) &&
           ((local_60->waitp->how == (MuHow)kExclusiveS || (local_58 == head)))) {
          if (local_50 == (PerThreadSynch *)0x0) {
            local_50 = head;
          }
          if (local_50->next != local_60) {
            absl::lts_20240722::raw_log_internal::RawLog
                      (kFatal,"mutex.cc",0x91b,"Check %s failed: %s","pw->next == w",
                       "pw not w\'s predecessor");
            __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/synchronization/mutex.cc"
                          ,0x91b,"void absl::Mutex::UnlockSlow(SynchWaitParams *)");
          }
          goto LAB_00106d95;
        }
        if (local_58 != head) {
          pPVar10 = local_58;
          if (local_58 == (PerThreadSynch *)0x0) {
            pPVar10 = head;
          }
          pPVar11 = pPVar10->next;
          head->may_skip = false;
          if (head->skip != (PerThreadSynch *)0x0) {
            absl::lts_20240722::raw_log_internal::RawLog
                      (kFatal,"mutex.cc",0x8e2,"Check %s failed: %s","h->skip == nullptr",
                       "illegal skip from head");
            __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/synchronization/mutex.cc"
                          ,0x8e2,"void absl::Mutex::UnlockSlow(SynchWaitParams *)");
          }
          head->maybe_unlocking = true;
          (this->mu_).super___atomic_base<long>._M_i = uVar16;
          do {
            pPVar11->wake = false;
            pCVar2 = pPVar11->waitp->cond;
            if ((pCVar2 == (Condition *)0x0) ||
               (bVar18 = (*pCVar2->eval_)(pCVar2), puVar14 = (undefined1 *)extraout_RDX_02, bVar18))
            {
              if (local_60 == (PerThreadSynch *)0x0) {
                pPVar11->wake = true;
                local_60 = pPVar11;
                local_50 = local_58;
                if (pPVar11->waitp->how == (MuHow)kExclusiveS) {
                  pPVar10 = (PerThreadSynch *)0x20;
                  local_58 = head;
                  goto LAB_001069a9;
                }
              }
              else if (pPVar11->waitp->how == (MuHow)kSharedS) {
                pPVar11->wake = true;
              }
              else {
                local_40 = (PerThreadSynch *)0x20;
              }
            }
            if ((pPVar11->wake == false) &&
               (pPVar10 = pPVar11->skip, pPVar10 != (PerThreadSynch *)0x0)) {
              pPVar4 = pPVar11;
              for (pPVar3 = pPVar10->skip; pPVar6 = pPVar10, pPVar3 != (PerThreadSynch *)0x0;
                  pPVar3 = pPVar3->skip) {
                pPVar4->skip = pPVar3;
                pPVar10 = pPVar3;
                puVar14 = (undefined1 *)pPVar6;
                pPVar4 = pPVar6;
              }
              pPVar11->skip = pPVar6;
              pPVar11 = pPVar6;
            }
            pPVar10 = local_40;
            local_58 = head;
            if (pPVar11 == head) goto LAB_001069a9;
            local_58 = pPVar11;
            pPVar11 = pPVar11->next;
          } while( true );
        }
        head->readers = 0;
        head->maybe_unlocking = false;
        if (waitp == (SynchWaitParams *)0x0) {
          uVar16 = uVar16 & 0xffffffffffffff96;
        }
        else {
          pPVar10 = Enqueue(head,waitp,uVar16,2);
          uVar15 = uVar15 & 0x96;
LAB_00106d7e:
          uVar16 = (ulong)uVar15 | (ulong)pPVar10;
        }
        goto LAB_00106e97;
      }
      head->next->wake = true;
      local_40 = (PerThreadSynch *)0x20;
      local_50 = head;
LAB_00106d95:
      pPVar10 = (PerThreadSynch *)&wake_list;
      bVar5 = 0;
      pPVar11 = head;
      break;
    }
    uVar13 = uVar16 & 0xffffffffffffffd7;
LAB_001069f9:
    LOCK();
    bVar18 = uVar16 == (this->mu_).super___atomic_base<long>._M_i;
    if (bVar18) {
      (this->mu_).super___atomic_base<long>._M_i = uVar13;
    }
    UNLOCK();
    if (bVar18) {
      return;
    }
LAB_00106a1f:
    uVar9 = synchronization_internal::MutexDelay((synchronization_internal *)(ulong)uVar9,0,mode);
    puVar14 = (undefined1 *)extraout_RDX_01;
  } while( true );
  do {
    pPVar3 = local_50->next;
    if (pPVar3->wake == true) {
      if (local_50->skip != (PerThreadSynch *)0x0) {
        absl::lts_20240722::raw_log_internal::RawLog
                  (kFatal,"mutex.cc",0x43c,"Check %s failed: %s","pw->skip == nullptr",
                   "bad skip in DequeueAllWakeable");
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/synchronization/mutex.cc"
                      ,0x43c,
                      "PerThreadSynch *absl::DequeueAllWakeable(PerThreadSynch *, PerThreadSynch *, PerThreadSynch **)"
                     );
      }
      pPVar11 = Dequeue(pPVar11,local_50);
      pPVar3->next = pPVar10->next;
      pPVar10->next = pPVar3;
      if ((pPVar11 != head) || (pPVar10 = pPVar3, pPVar3->waitp->how == (MuHow)kExclusiveS)) break;
    }
    else {
      pPVar4 = pPVar3->skip;
      bVar5 = 1;
      local_50 = pPVar3;
      if (pPVar4 != (PerThreadSynch *)0x0) {
        pPVar6 = pPVar3;
        for (pPVar7 = pPVar4->skip; pPVar7 != (PerThreadSynch *)0x0; pPVar7 = pPVar7->skip) {
          pPVar6->skip = pPVar7;
          pPVar6 = pPVar4;
          pPVar4 = pPVar7;
        }
        pPVar3->skip = pPVar4;
        local_50 = pPVar4;
      }
    }
  } while (!(bool)(local_50 == pPVar11 & bVar5));
  if (waitp != (SynchWaitParams *)0x0) {
    pPVar11 = Enqueue(pPVar11,waitp,uVar16,2);
  }
  if (wake_list == (PerThreadSynch *)0x1) {
    absl::lts_20240722::raw_log_internal::RawLog
              (kFatal,"mutex.cc",0x932,"Check %s failed: %s","wake_list != kPerThreadSynchNull",
               "unexpected empty wake list");
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/synchronization/mutex.cc"
                  ,0x932,"void absl::Mutex::UnlockSlow(SynchWaitParams *)");
  }
  if (pPVar11 == (PerThreadSynch *)0x0) {
    uVar16 = (ulong)(uVar15 & 0x10) | 2;
  }
  else {
    pPVar11->readers = 0;
    pPVar11->maybe_unlocking = false;
    uVar16 = (ulong)local_40 | (ulong)pPVar11 | (ulong)(uVar15 & 0x10) | 6;
  }
LAB_00106e97:
  (this->mu_).super___atomic_base<long>._M_i = uVar16;
LAB_00106e9a:
  if (wake_list != (PerThreadSynch *)0x1) {
    if (base_internal::CycleClock::cycle_clock_source_ == (code *)0x0) {
      lVar12 = rdtsc();
    }
    else {
      lVar12 = (*base_internal::CycleClock::cycle_clock_source_)();
    }
    lVar17 = 0;
    do {
      if (wake_list->cond_waiter == false) {
        pSVar1 = wake_list->waitp;
        lVar17 = lVar17 + ((lVar12 >> 2) - pSVar1->contention_start_cycles);
        pSVar1->contention_start_cycles = lVar12 >> 2;
        pSVar1->should_submit_contention_data = true;
      }
      pPVar10 = wake_list->next;
      wake_list->next = (PerThreadSynch *)0x0;
      (wake_list->state)._M_i = kAvailable;
      AbslInternalPerThreadSemPost_lts_20240722((ThreadIdentity *)wake_list);
      wake_list = pPVar10;
    } while (pPVar10 != (PerThreadSynch *)0x1);
    if (0 < lVar17) {
      (*(code *)(anonymous_namespace)::mutex_tracer)("slow release",this,lVar17);
      (*(code *)(anonymous_namespace)::submit_profile_data)(lVar17);
      return;
    }
  }
  return;
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE void Mutex::UnlockSlow(SynchWaitParams* waitp) {
  SchedulingGuard::ScopedDisable disable_rescheduling;
  intptr_t v = mu_.load(std::memory_order_relaxed);
  this->AssertReaderHeld();
  CheckForMutexCorruption(v, "Unlock");
  if ((v & kMuEvent) != 0) {
    PostSynchEvent(
        this, (v & kMuWriter) != 0 ? SYNCH_EV_UNLOCK : SYNCH_EV_READERUNLOCK);
  }
  int c = 0;
  // the waiter under consideration to wake, or zero
  PerThreadSynch* w = nullptr;
  // the predecessor to w or zero
  PerThreadSynch* pw = nullptr;
  // head of the list searched previously, or zero
  PerThreadSynch* old_h = nullptr;
  // a condition that's known to be false.
  PerThreadSynch* wake_list = kPerThreadSynchNull;  // list of threads to wake
  intptr_t wr_wait = 0;  // set to kMuWrWait if we wake a reader and a
                         // later writer could have acquired the lock
                         // (starvation avoidance)
  ABSL_RAW_CHECK(waitp == nullptr || waitp->thread->waitp == nullptr ||
                     waitp->thread->suppress_fatal_errors,
                 "detected illegal recursion into Mutex code");
  // This loop finds threads wake_list to wakeup if any, and removes them from
  // the list of waiters.  In addition, it places waitp.thread on the queue of
  // waiters if waitp is non-zero.
  for (;;) {
    v = mu_.load(std::memory_order_relaxed);
    if ((v & kMuWriter) != 0 && (v & (kMuWait | kMuDesig)) != kMuWait &&
        waitp == nullptr) {
      // fast writer release (writer with no waiters or with designated waker)
      if (mu_.compare_exchange_strong(v, v & ~(kMuWrWait | kMuWriter),
                                      std::memory_order_release,
                                      std::memory_order_relaxed)) {
        return;
      }
    } else if ((v & (kMuReader | kMuWait)) == kMuReader && waitp == nullptr) {
      // fast reader release (reader with no waiters)
      intptr_t clear = ExactlyOneReader(v) ? kMuReader | kMuOne : kMuOne;
      if (mu_.compare_exchange_strong(v, v - clear, std::memory_order_release,
                                      std::memory_order_relaxed)) {
        return;
      }
    } else if ((v & kMuSpin) == 0 &&  // attempt to get spinlock
               mu_.compare_exchange_strong(v, v | kMuSpin,
                                           std::memory_order_acquire,
                                           std::memory_order_relaxed)) {
      if ((v & kMuWait) == 0) {  // no one to wake
        intptr_t nv;
        bool do_enqueue = true;  // always Enqueue() the first time
        ABSL_RAW_CHECK(waitp != nullptr,
                       "UnlockSlow is confused");  // about to sleep
        do {  // must loop to release spinlock as reader count may change
          v = mu_.load(std::memory_order_relaxed);
          // decrement reader count if there are readers
          intptr_t new_readers = (v >= kMuOne) ? v - kMuOne : v;
          PerThreadSynch* new_h = nullptr;
          if (do_enqueue) {
            // If we are enqueuing on a CondVar (waitp->cv_word != nullptr) then
            // we must not retry here.  The initial attempt will always have
            // succeeded, further attempts would enqueue us against *this due to
            // Fer() handling.
            do_enqueue = (waitp->cv_word == nullptr);
            new_h = Enqueue(nullptr, waitp, new_readers, kMuIsCond);
          }
          intptr_t clear = kMuWrWait | kMuWriter;  // by default clear write bit
          if ((v & kMuWriter) == 0 && ExactlyOneReader(v)) {  // last reader
            clear = kMuWrWait | kMuReader;                    // clear read bit
          }
          nv = (v & kMuLow & ~clear & ~kMuSpin);
          if (new_h != nullptr) {
            nv |= kMuWait | reinterpret_cast<intptr_t>(new_h);
          } else {  // new_h could be nullptr if we queued ourselves on a
                    // CondVar
            // In that case, we must place the reader count back in the mutex
            // word, as Enqueue() did not store it in the new waiter.
            nv |= new_readers & kMuHigh;
          }
          // release spinlock & our lock; retry if reader-count changed
          // (writer count cannot change since we hold lock)
        } while (!mu_.compare_exchange_weak(v, nv, std::memory_order_release,
                                            std::memory_order_relaxed));
        break;
      }

      // There are waiters.
      // Set h to the head of the circular waiter list.
      PerThreadSynch* h = GetPerThreadSynch(v);
      if ((v & kMuReader) != 0 && (h->readers & kMuHigh) > kMuOne) {
        // a reader but not the last
        h->readers -= kMuOne;    // release our lock
        intptr_t nv = v;         // normally just release spinlock
        if (waitp != nullptr) {  // but waitp!=nullptr => must queue ourselves
          PerThreadSynch* new_h = Enqueue(h, waitp, v, kMuIsCond);
          ABSL_RAW_CHECK(new_h != nullptr,
                         "waiters disappeared during Enqueue()!");
          nv &= kMuLow;
          nv |= kMuWait | reinterpret_cast<intptr_t>(new_h);
        }
        mu_.store(nv, std::memory_order_release);  // release spinlock
        // can release with a store because there were waiters
        break;
      }

      // Either we didn't search before, or we marked the queue
      // as "maybe_unlocking" and no one else should have changed it.
      ABSL_RAW_CHECK(old_h == nullptr || h->maybe_unlocking,
                     "Mutex queue changed beneath us");

      // The lock is becoming free, and there's a waiter
      if (old_h != nullptr &&
          !old_h->may_skip) {    // we used old_h as a terminator
        old_h->may_skip = true;  // allow old_h to skip once more
        ABSL_RAW_CHECK(old_h->skip == nullptr, "illegal skip from head");
        if (h != old_h && MuEquivalentWaiter(old_h, old_h->next)) {
          old_h->skip = old_h->next;  // old_h not head & can skip to successor
        }
      }
      if (h->next->waitp->how == kExclusive &&
          h->next->waitp->cond == nullptr) {
        // easy case: writer with no condition; no need to search
        pw = h;  // wake w, the successor of h (=pw)
        w = h->next;
        w->wake = true;
        // We are waking up a writer.  This writer may be racing against
        // an already awake reader for the lock.  We want the
        // writer to usually win this race,
        // because if it doesn't, we can potentially keep taking a reader
        // perpetually and writers will starve.  Worse than
        // that, this can also starve other readers if kMuWrWait gets set
        // later.
        wr_wait = kMuWrWait;
      } else if (w != nullptr && (w->waitp->how == kExclusive || h == old_h)) {
        // we found a waiter w to wake on a previous iteration and either it's
        // a writer, or we've searched the entire list so we have all the
        // readers.
        if (pw == nullptr) {  // if w's predecessor is unknown, it must be h
          pw = h;
        }
      } else {
        // At this point we don't know all the waiters to wake, and the first
        // waiter has a condition or is a reader.  We avoid searching over
        // waiters we've searched on previous iterations by starting at
        // old_h if it's set.  If old_h==h, there's no one to wakeup at all.
        if (old_h == h) {  // we've searched before, and nothing's new
                           // so there's no one to wake.
          intptr_t nv = (v & ~(kMuReader | kMuWriter | kMuWrWait));
          h->readers = 0;
          h->maybe_unlocking = false;  // finished unlocking
          if (waitp != nullptr) {      // we must queue ourselves and sleep
            PerThreadSynch* new_h = Enqueue(h, waitp, v, kMuIsCond);
            nv &= kMuLow;
            if (new_h != nullptr) {
              nv |= kMuWait | reinterpret_cast<intptr_t>(new_h);
            }  // else new_h could be nullptr if we queued ourselves on a
               // CondVar
          }
          // release spinlock & lock
          // can release with a store because there were waiters
          mu_.store(nv, std::memory_order_release);
          break;
        }

        // set up to walk the list
        PerThreadSynch* w_walk;   // current waiter during list walk
        PerThreadSynch* pw_walk;  // previous waiter during list walk
        if (old_h != nullptr) {  // we've searched up to old_h before
          pw_walk = old_h;
          w_walk = old_h->next;
        } else {  // no prior search, start at beginning
          pw_walk =
              nullptr;  // h->next's predecessor may change; don't record it
          w_walk = h->next;
        }

        h->may_skip = false;  // ensure we never skip past h in future searches
                              // even if other waiters are queued after it.
        ABSL_RAW_CHECK(h->skip == nullptr, "illegal skip from head");

        h->maybe_unlocking = true;  // we're about to scan the waiter list
                                    // without the spinlock held.
                                    // Enqueue must be conservative about
                                    // priority queuing.

        // We must release the spinlock to evaluate the conditions.
        mu_.store(v, std::memory_order_release);  // release just spinlock
        // can release with a store because there were waiters

        // h is the last waiter queued, and w_walk the first unsearched waiter.
        // Without the spinlock, the locations mu_ and h->next may now change
        // underneath us, but since we hold the lock itself, the only legal
        // change is to add waiters between h and w_walk.  Therefore, it's safe
        // to walk the path from w_walk to h inclusive. (TryRemove() can remove
        // a waiter anywhere, but it acquires both the spinlock and the Mutex)

        old_h = h;  // remember we searched to here

        // Walk the path upto and including h looking for waiters we can wake.
        while (pw_walk != h) {
          w_walk->wake = false;
          if (w_walk->waitp->cond ==
                  nullptr ||  // no condition => vacuously true OR
                              // this thread's condition is true
              EvalConditionIgnored(this, w_walk->waitp->cond)) {
            if (w == nullptr) {
              w_walk->wake = true;  // can wake this waiter
              w = w_walk;
              pw = pw_walk;
              if (w_walk->waitp->how == kExclusive) {
                wr_wait = kMuWrWait;
                break;  // bail if waking this writer
              }
            } else if (w_walk->waitp->how == kShared) {  // wake if a reader
              w_walk->wake = true;
            } else {  // writer with true condition
              wr_wait = kMuWrWait;
            }
          }
          if (w_walk->wake) {  // we're waking reader w_walk
            pw_walk = w_walk;  // don't skip similar waiters
          } else {             // not waking; skip as much as possible
            pw_walk = Skip(w_walk);
          }
          // If pw_walk == h, then load of pw_walk->next can race with
          // concurrent write in Enqueue(). However, at the same time
          // we do not need to do the load, because we will bail out
          // from the loop anyway.
          if (pw_walk != h) {
            w_walk = pw_walk->next;
          }
        }

        continue;  // restart for(;;)-loop to wakeup w or to find more waiters
      }
      ABSL_RAW_CHECK(pw->next == w, "pw not w's predecessor");
      // The first (and perhaps only) waiter we've chosen to wake is w, whose
      // predecessor is pw.  If w is a reader, we must wake all the other
      // waiters with wake==true as well.  We may also need to queue
      // ourselves if waitp != null.  The spinlock and the lock are still
      // held.

      // This traverses the list in [ pw->next, h ], where h is the head,
      // removing all elements with wake==true and placing them in the
      // singly-linked list wake_list.  Returns the new head.
      h = DequeueAllWakeable(h, pw, &wake_list);

      intptr_t nv = (v & kMuEvent) | kMuDesig;
      // assume no waiters left,
      // set kMuDesig for INV1a

      if (waitp != nullptr) {  // we must queue ourselves and sleep
        h = Enqueue(h, waitp, v, kMuIsCond);
        // h is new last waiter; could be null if we queued ourselves on a
        // CondVar
      }

      ABSL_RAW_CHECK(wake_list != kPerThreadSynchNull,
                     "unexpected empty wake list");

      if (h != nullptr) {  // there are waiters left
        h->readers = 0;
        h->maybe_unlocking = false;  // finished unlocking
        nv |= wr_wait | kMuWait | reinterpret_cast<intptr_t>(h);
      }

      // release both spinlock & lock
      // can release with a store because there were waiters
      mu_.store(nv, std::memory_order_release);
      break;  // out of for(;;)-loop
    }
    // aggressive here; no one can proceed till we do
    c = synchronization_internal::MutexDelay(c, AGGRESSIVE);
  }  // end of for(;;)-loop

  if (wake_list != kPerThreadSynchNull) {
    int64_t total_wait_cycles = 0;
    int64_t max_wait_cycles = 0;
    int64_t now = CycleClock::Now();
    do {
      // Profile lock contention events only if the waiter was trying to acquire
      // the lock, not waiting on a condition variable or Condition.
      if (!wake_list->cond_waiter) {
        int64_t cycles_waited =
            (now - wake_list->waitp->contention_start_cycles);
        total_wait_cycles += cycles_waited;
        if (max_wait_cycles == 0) max_wait_cycles = cycles_waited;
        wake_list->waitp->contention_start_cycles = now;
        wake_list->waitp->should_submit_contention_data = true;
      }
      wake_list = Wakeup(wake_list);  // wake waiters
    } while (wake_list != kPerThreadSynchNull);
    if (total_wait_cycles > 0) {
      mutex_tracer("slow release", this, total_wait_cycles);
      ABSL_TSAN_MUTEX_PRE_DIVERT(this, 0);
      submit_profile_data(total_wait_cycles);
      ABSL_TSAN_MUTEX_POST_DIVERT(this, 0);
    }
  }
}